

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O0

void __thiscall LiteScript::Namer::LoadIDs(Namer *this,istream *stream)

{
  Memory *pMVar1;
  uint uVar2;
  Object *pOVar3;
  Nullable<LiteScript::Variable> local_80;
  value_type local_60;
  uint local_4c;
  uint local_48;
  uint i;
  uint sz;
  Nullable<LiteScript::Variable> local_38;
  istream *local_18;
  istream *stream_local;
  Namer *this_local;
  
  local_18 = stream;
  stream_local = (istream *)this;
  pOVar3 = Variable::operator->(&this->global);
  pMVar1 = pOVar3->memory;
  uVar2 = IStreamer::Read<unsigned_int>(local_18);
  Memory::GetVariable(&local_38,pMVar1,uVar2);
  Nullable<LiteScript::Variable>::operator=(&this->current,&local_38);
  Nullable<LiteScript::Variable>::~Nullable(&local_38);
  local_48 = IStreamer::Read<unsigned_int>(local_18);
  for (local_4c = 0; local_4c < local_48; local_4c = local_4c + 1) {
    pOVar3 = Variable::operator->(&this->global);
    pMVar1 = pOVar3->memory;
    uVar2 = IStreamer::Read<unsigned_int>(local_18);
    Memory::GetVariable(&local_80,pMVar1,uVar2);
    Nullable::operator_cast_to_Variable((Nullable *)&local_60);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&this->heap,&local_60);
    Variable::~Variable(&local_60);
    Nullable<LiteScript::Variable>::~Nullable(&local_80);
  }
  return;
}

Assistant:

void LiteScript::Namer::LoadIDs(std::istream &stream) {
    this->current = this->global->memory.GetVariable(IStreamer::Read<unsigned int>(stream));
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        this->heap.push_back(this->global->memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
}